

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

Real __thiscall amrex::MultiFab::sum_unique(MultiFab *this,int comp,bool local,Periodicity *period)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  longdouble lVar6;
  bool bVar7;
  byte in_DL;
  int in_ESI;
  literals *plVar8;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Real tmp;
  Array4<const_int> *msk;
  Array4<const_double> *a;
  Box *bx;
  MFIter mfi;
  Real sm;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> owner_mask;
  undefined4 in_stack_fffffffffffffd08;
  MPI_Comm in_stack_fffffffffffffd0c;
  undefined2 in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd12;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd18;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *in_stack_fffffffffffffd20;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *local_2d8;
  Periodicity *in_stack_fffffffffffffd30;
  int *piVar9;
  FabArrayBase *in_stack_fffffffffffffd38;
  MFIter *in_stack_fffffffffffffd40;
  int local_29c;
  int local_298;
  int local_294;
  MFIter *in_stack_fffffffffffffd70;
  double local_250;
  literals local_248 [64];
  literals *local_208;
  literals local_200 [64];
  literals *local_1c0;
  int local_1b4;
  undefined1 in_stack_fffffffffffffe53;
  int in_stack_fffffffffffffe54;
  MultiFab *in_stack_fffffffffffffe58;
  MFIter local_180;
  Real local_120;
  uint local_10c [3];
  byte local_fd;
  int local_fc;
  Real local_f0;
  undefined8 local_e8;
  int local_e0;
  int *local_d8;
  int local_cc;
  int iStack_c8;
  int local_c4;
  MFIter *local_c0;
  int local_b8;
  int *local_b0;
  int local_a4;
  int iStack_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  literals *local_88;
  int local_7c;
  int local_78;
  int local_74;
  literals *local_70;
  uint *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_fd = in_DL & 1;
  local_fc = in_ESI;
  local_10c[0] = (uint)FabArrayBase::ixType
                                 ((FabArrayBase *)
                                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  local_68 = local_10c;
  if (local_10c[0] == 0) {
    local_f0 = sum(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   (bool)in_stack_fffffffffffffe53);
  }
  else {
    OwnerMask((MultiFab *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    local_120 = 0.0;
    MFIter::MFIter(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0));
    while (bVar7 = MFIter::isValid(&local_180), bVar7) {
      piVar9 = &local_1b4;
      MFIter::tilebox(in_stack_fffffffffffffd70);
      plVar8 = local_200;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffd18,
                 (MFIter *)CONCAT62(in_stack_fffffffffffffd12,in_stack_fffffffffffffd10));
      local_1c0 = plVar8;
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x128afc9);
      plVar8 = local_248;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffd18,
                 (MFIter *)CONCAT62(in_stack_fffffffffffffd12,in_stack_fffffffffffffd10));
      lVar6 = (longdouble)0;
      in_stack_fffffffffffffd0c = (MPI_Comm)((unkuint10)lVar6 >> 0x20);
      in_stack_fffffffffffffd10 = (undefined2)((unkuint10)lVar6 >> 0x40);
      local_208 = local_248;
      local_250 = literals::operator____rt(plVar8,lVar6);
      local_c = 0;
      iVar1 = *piVar9;
      local_1c = 1;
      iVar2 = piVar9[1];
      local_e8 = *(undefined8 *)piVar9;
      local_2c = 2;
      local_294 = piVar9[2];
      local_38 = piVar9 + 3;
      local_3c = 0;
      iVar3 = *local_38;
      local_48 = piVar9 + 3;
      local_4c = 1;
      iVar4 = piVar9[4];
      in_stack_fffffffffffffd70 = *(MFIter **)local_38;
      local_58 = piVar9 + 3;
      local_5c = 2;
      iVar5 = piVar9[5];
      local_e0 = local_294;
      local_d8 = piVar9;
      local_cc = iVar1;
      iStack_c8 = iVar2;
      local_c4 = local_294;
      local_c0 = in_stack_fffffffffffffd70;
      local_b8 = iVar5;
      local_b0 = piVar9;
      local_a4 = iVar3;
      iStack_a0 = iVar4;
      local_9c = iVar5;
      local_28 = piVar9;
      local_18 = piVar9;
      local_8 = piVar9;
      for (; local_298 = iVar2, local_294 <= iVar5; local_294 = local_294 + 1) {
        for (; local_29c = iVar1, local_298 <= iVar4; local_298 = local_298 + 1) {
          for (; local_29c <= iVar3; local_29c = local_29c + 1) {
            local_70 = local_208;
            local_74 = local_29c;
            local_78 = local_298;
            local_7c = local_294;
            if (*(int *)(*(long *)local_208 +
                        ((long)(local_29c - *(int *)(local_208 + 0x20)) +
                         (long)(local_298 - *(int *)(local_208 + 0x24)) * *(long *)(local_208 + 8) +
                        (long)(local_294 - *(int *)(local_208 + 0x28)) * *(long *)(local_208 + 0x10)
                        ) * 4) == 0) {
              lVar6 = (longdouble)0;
              in_stack_fffffffffffffd0c = (MPI_Comm)((unkuint10)lVar6 >> 0x20);
              in_stack_fffffffffffffd10 = (undefined2)((unkuint10)lVar6 >> 0x40);
              in_stack_fffffffffffffd20 =
                   (unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                   literals::operator____rt(plVar8,lVar6);
              local_2d8 = in_stack_fffffffffffffd20;
            }
            else {
              local_88 = local_1c0;
              local_8c = local_29c;
              local_90 = local_298;
              local_94 = local_294;
              local_98 = local_fc;
              local_2d8 = *(unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> **)
                           (*(long *)local_1c0 +
                           ((long)(local_29c - *(int *)(local_1c0 + 0x20)) +
                            (long)(local_298 - *(int *)(local_1c0 + 0x24)) *
                            *(long *)(local_1c0 + 8) +
                            (long)(local_294 - *(int *)(local_1c0 + 0x28)) *
                            *(long *)(local_1c0 + 0x10) +
                           (long)local_fc * *(long *)(local_1c0 + 0x18)) * 8);
              plVar8 = local_1c0;
            }
            local_250 = (double)local_2d8 + local_250;
          }
        }
      }
      local_120 = local_250 + local_120;
      MFIter::operator++(&local_180);
    }
    MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffffd12,in_stack_fffffffffffffd10));
    if ((local_fd & 1) == 0) {
      ParallelContext::CommunicatorSub();
      ParallelAllReduce::Sum<double>
                ((double *)CONCAT62(in_stack_fffffffffffffd12,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd0c);
    }
    local_f0 = local_120;
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
              (in_stack_fffffffffffffd20);
  }
  return local_f0;
}

Assistant:

Real
MultiFab::sum_unique (int comp,
                      bool local,
                      const Periodicity& period) const
{
    BL_PROFILE("MultiFab::sum_unique()");

    // no duplicatly distributed points if cell centered
    if (ixType().cellCentered())
        return this->sum(comp, local);

    // Owner is the grid with the lowest grid number containing the data
    std::unique_ptr<iMultiFab> owner_mask = OwnerMask(period);

    Real sm = Real(0.0);
#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& msk = owner_mask->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this, IntVect(0),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                       -> GpuTuple<Real>
        {
            return msk[box_no](i,j,k) ? ma[box_no](i,j,k,comp) : 0.0_rt;
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Array4<Real const> const& a = this->const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            Real tmp = 0.0_rt;
            AMREX_LOOP_3D(bx, i, j, k,
            {
                tmp += msk(i,j,k) ? a(i,j,k,comp) : 0.0_rt;
            });
            sm += tmp; // Do it this way so that it does not break regression tests.
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}